

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuregistrarproxy_p.cpp
# Opt level: O2

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  QDBusPendingReply<QString,_QDBusObjectPath> _r;
  QDBusReply<QString> local_68;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
        goto switchD_0058d0dd_default;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
    goto switchD_0058d0dd_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0058d0dd_default;
  switch(_id) {
  case 0:
    local_68.m_error._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    GetMenuForWindow((QDBusPendingReply<QString,_QDBusObjectPath> *)&local_68,
                     (QDBusMenuRegistrarInterface *)_o,*_a[1]);
    if ((QDBusPendingReply<QString,_QDBusObjectPath> *)*_a !=
        (QDBusPendingReply<QString,_QDBusObjectPath> *)0x0) {
      QDBusPendingReply<QString,_QDBusObjectPath>::assign
                ((QDBusPendingReply<QString,_QDBusObjectPath> *)*_a,(QDBusPendingCall *)&local_68);
    }
    goto LAB_0058d192;
  case 1:
    local_68.m_data.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_data.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_data.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error.nm.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error.unused = &DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error.nm.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error.nm.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error.msg.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error.msg.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68.m_error.msg.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    GetMenuForWindow(&local_68,(QDBusMenuRegistrarInterface *)_o,*_a[1],(QDBusObjectPath *)_a[2]);
    if ((QDBusReply<QString> *)*_a != (QDBusReply<QString> *)0x0) {
      QDBusReply<QString>::operator=((QDBusReply<QString> *)*_a,&local_68);
    }
    QDBusReply<QString>::~QDBusReply(&local_68);
    goto switchD_0058d0dd_default;
  case 2:
    local_68.m_error._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    RegisterWindow((QDBusPendingReply<> *)&local_68,(QDBusMenuRegistrarInterface *)_o,*_a[1],
                   (QDBusObjectPath *)_a[2]);
    break;
  case 3:
    local_68.m_error._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    UnregisterWindow((QDBusPendingReply<> *)&local_68,(QDBusMenuRegistrarInterface *)_o,*_a[1]);
    break;
  default:
    goto switchD_0058d0dd_default;
  }
  if ((QDBusPendingReply<> *)*_a != (QDBusPendingReply<> *)0x0) {
    QDBusPendingReply<>::assign((QDBusPendingReply<> *)*_a,(QDBusPendingCall *)&local_68);
  }
LAB_0058d192:
  QDBusPendingReplyBase::~QDBusPendingReplyBase((QDBusPendingReplyBase *)&local_68);
switchD_0058d0dd_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuRegistrarInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { QDBusPendingReply<QString,QDBusObjectPath> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QDBusObjectPath>*>(_a[0]) = std::move(_r); }  break;
        case 1: { QDBusReply<QString> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 2: { QDBusPendingReply<> _r = _t->RegisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<> _r = _t->UnregisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusObjectPath >(); break;
            }
            break;
        }
    }
}